

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::find_layer_index_by_name(Net *this,char *name)

{
  pointer ppLVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppLVar1 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->d->layers).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar3) break;
    bVar2 = std::operator==(&ppLVar1[uVar3]->name,name);
    if (bVar2) goto LAB_00132a69;
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"find_layer_index_by_name %s failed",name);
  fputc(10,_stderr);
  uVar3 = 0xffffffffffffffff;
LAB_00132a69:
  return (int)uVar3;
}

Assistant:

int Net::find_layer_index_by_name(const char* name) const
{
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        const Layer* layer = d->layers[i];
        if (layer->name == name)
        {
            return static_cast<int>(i);
        }
    }

    NCNN_LOGE("find_layer_index_by_name %s failed", name);
    return -1;
}